

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v9::detail::is_printable
               (uint16_t x,singleton *singletons,size_t singletons_size,uchar *singleton_lowers,
               uchar *normal,size_t normal_size)

{
  bool bVar1;
  uint local_6c;
  int len;
  int v;
  size_t i_1;
  bool current;
  int xsigned;
  int j;
  int lower_end;
  singleton s;
  size_t i;
  int lower_start;
  int upper;
  size_t normal_size_local;
  uchar *normal_local;
  uchar *singleton_lowers_local;
  size_t singletons_size_local;
  singleton *singletons_local;
  uint16_t x_local;
  
  lower_start = 0;
  for (i = 0; i < singletons_size; i = i + 1) {
    s.lower_count = singletons[i].lower_count;
    s.upper = singletons[i].upper;
    if ((uint)((int)(uint)x >> 8) < (uint)s.upper) break;
    if ((int)(uint)x >> 8 == (uint)s.upper) {
      for (j = lower_start; j < (int)(lower_start + (uint)s.lower_count); j = j + 1) {
        if ((ushort)singleton_lowers[j] == (x & 0xff)) {
          return false;
        }
      }
    }
    lower_start = lower_start + (uint)s.lower_count;
  }
  xsigned = (int)x;
  bVar1 = true;
  i_1 = 0;
  while( true ) {
    if (normal_size <= i_1) {
      return bVar1;
    }
    local_6c = (uint)normal[i_1];
    if ((normal[i_1] & 0x80) != 0) {
      local_6c = (local_6c & 0x7f) << 8 | (uint)normal[i_1 + 1];
      i_1 = i_1 + 1;
    }
    xsigned = xsigned - local_6c;
    if (xsigned < 0) break;
    bVar1 = (bool)(bVar1 ^ 1);
    i_1 = i_1 + 1;
  }
  return bVar1;
}

Assistant:

inline auto is_printable(uint16_t x, const singleton* singletons,
                         size_t singletons_size,
                         const unsigned char* singleton_lowers,
                         const unsigned char* normal, size_t normal_size)
    -> bool {
  auto upper = x >> 8;
  auto lower_start = 0;
  for (size_t i = 0; i < singletons_size; ++i) {
    auto s = singletons[i];
    auto lower_end = lower_start + s.lower_count;
    if (upper < s.upper) break;
    if (upper == s.upper) {
      for (auto j = lower_start; j < lower_end; ++j) {
        if (singleton_lowers[j] == (x & 0xff)) return false;
      }
    }
    lower_start = lower_end;
  }

  auto xsigned = static_cast<int>(x);
  auto current = true;
  for (size_t i = 0; i < normal_size; ++i) {
    auto v = static_cast<int>(normal[i]);
    auto len = (v & 0x80) != 0 ? (v & 0x7f) << 8 | normal[++i] : v;
    xsigned -= len;
    if (xsigned < 0) break;
    current = !current;
  }
  return current;
}